

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

void MapOptHandler_skyfog(FMapInfoParser *parse,level_info_t *info)

{
  FName local_24;
  FGLROptions *local_20;
  FGLROptions *opt;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  opt = (FGLROptions *)info;
  info_local = (level_info_t *)parse;
  FName::FName(&local_24,"gl_renderer");
  local_20 = level_info_t::GetOptData<FGLROptions>(info,&local_24,true);
  FMapInfoParser::ParseAssign((FMapInfoParser *)info_local);
  FScanner::MustGetNumber((FScanner *)info_local);
  local_20->skyfog = *(int *)&(info_local->NextMap).Chars;
  return;
}

Assistant:

DEFINE_MAP_OPTION(skyfog, false)
{
	FGLROptions *opt = info->GetOptData<FGLROptions>("gl_renderer");
	parse.ParseAssign();
	parse.sc.MustGetNumber();
	opt->skyfog = parse.sc.Number;
}